

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

TextLocation ON_DimStyle::TextLocationFromUnsigned(uint dim_text_location_as_unsigned)

{
  if (2 < dim_text_location_as_unsigned) {
    dim_text_location_as_unsigned = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
               ,0x233,"","invalid dim_text_location_as_unsigned parameter.");
  }
  return (TextLocation)dim_text_location_as_unsigned;
}

Assistant:

ON_DimStyle::TextLocation ON_DimStyle::TextLocationFromUnsigned(
  unsigned int dim_text_location_as_unsigned
  )
{
  switch (dim_text_location_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::TextLocation::AboveDimLine);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::TextLocation::InDimLine);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::TextLocation::BelowDimLine);
  }
  ON_ERROR("invalid dim_text_location_as_unsigned parameter.");
  return (ON_DimStyle::TextLocation::AboveDimLine);
}